

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  char *pcVar3;
  char *__s;
  _Rb_tree_node_base *p_Var4;
  pointer pbVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  long *local_b8;
  char *local_b0;
  long local_a8 [2];
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  cmGlobalGenerator *local_70;
  pointer local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pcVar3 = cmLocalGenerator::GetSourceDirectory(lg);
  std::__cxx11::string::string((string *)&local_b8,pcVar3,(allocator *)&local_60);
  std::__cxx11::string::append((char *)&local_b8);
  bVar2 = cmsys::SystemTools::FileExists((char *)local_b8);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"\"git\": 1 ","");
  }
  else {
    __s = cmLocalGenerator::GetSourceDirectory(lg);
    pcVar3 = local_b0;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,pcVar3,(ulong)__s);
    std::__cxx11::string::append((char *)&local_b8);
    bVar2 = cmsys::SystemTools::FileExists((char *)local_b8);
    if (bVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"\"svn\": 1 ","");
    }
    else {
      pcVar3 = cmLocalGenerator::GetSourceDirectory(lg);
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,(ulong)pcVar3);
      std::__cxx11::string::append((char *)&local_b8);
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_70 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      ppcVar6 = (local_70->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (ppcVar6 !=
          (local_70->LocalGenerators).
          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pcVar1 = (*ppcVar6)->Makefile;
          for (pbVar5 = (pcVar1->ListFiles).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar5 != (pcVar1->ListFiles).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_60,__return_storage_ptr__);
          }
          local_68 = ppcVar6;
          for (ppcVar7 = (pcVar1->SourceFiles).
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppcVar7 !=
              (pcVar1->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
            this_00 = *ppcVar7;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"GENERATED","");
            bVar2 = cmSourceFile::GetPropertyAsBool(this_00,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (!bVar2) {
              cmSourceFile::GetFullPath(this_00,(string *)0x0);
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_60,__return_storage_ptr__);
            }
          }
          ppcVar6 = local_68 + 1;
        } while (ppcVar6 !=
                 (local_70->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x56e87d);
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        do {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var4 + 1));
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
    }
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator* lg) const
{
  std::string s = lg->GetSourceDirectory();
  s += "/.git";
  if (cmSystemTools::FileExists(s.c_str())) {
    return std::string("\"git\": 1 ");
  }

  s = lg->GetSourceDirectory();
  s += "/.svn";
  if (cmSystemTools::FileExists(s.c_str())) {
    return std::string("\"svn\": 1 ");
  }

  s = lg->GetSourceDirectory();
  s += "/";

  std::set<std::string> files;
  std::string tmp;
  const std::vector<cmLocalGenerator*>& lgs =
    this->GlobalGenerator->GetLocalGenerators();

  for (std::vector<cmLocalGenerator*>::const_iterator it = lgs.begin();
       it != lgs.end(); it++) {
    cmMakefile* makefile = (*it)->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt = listFiles.begin();
         lt != listFiles.end(); lt++) {
      tmp = *lt;
      {
        files.insert(tmp);
      }
    }

    const std::vector<cmSourceFile*>& sources = makefile->GetSourceFiles();
    for (std::vector<cmSourceFile*>::const_iterator sfIt = sources.begin();
         sfIt != sources.end(); sfIt++) {
      cmSourceFile* sf = *sfIt;
      if (sf->GetPropertyAsBool("GENERATED")) {
        continue;
      }

      tmp = sf->GetFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::set<std::string>::const_iterator it = files.begin();
       it != files.end(); ++it) {
    tmp += sep;
    tmp += " \"";
    tmp += *it;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}